

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

void __thiscall
gl4cts::GPUShaderFP64Test2::inspectProgram
          (GPUShaderFP64Test2 *this,GLuint program_id,GLint n_uniforms,
          uniformTypeDetails *uniform_type,GLint *out_buffer_size,
          uniformDetails *out_uniform_details,GLuint uniform_block_index)

{
  ostringstream *this_00;
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  MessageBuilder *this_01;
  TestError *this_02;
  GLuint index;
  GLenum type;
  GLsizei size;
  GLint matrix_stride;
  GLint local_38c;
  GLint offset;
  GLint array_stride;
  uniformTypeDetails *local_380;
  vector<char,_std::allocator<char>_> extracted_uniform_name;
  GLchar *uniform_name;
  string uniform_name_str;
  stringstream uniform_name_stream;
  ostream local_328;
  undefined1 local_1b0 [384];
  long lVar3;
  
  array_stride = 0;
  extracted_uniform_name.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  extracted_uniform_name.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  extracted_uniform_name.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38c = n_uniforms;
  local_380 = uniform_type;
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  index = 0;
  matrix_stride = 0;
  offset = 0;
  size = 0;
  type = 0;
  uniform_name = (GLchar *)0x0;
  uniform_name_str._M_dataplus._M_p = (pointer)&uniform_name_str.field_2;
  uniform_name_str._M_string_length = 0;
  uniform_name_str.field_2._M_local_buf[0] = '\0';
  std::__cxx11::stringstream::stringstream((stringstream *)&uniform_name_stream);
  iVar1 = (**(code **)(lVar3 + 0xb38))(program_id,m_uniform_block_name);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"GetUniformBlockIndex",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0xe16);
  if (iVar1 == -1) {
    this_02 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_02,"Unifom block is inactive",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
               ,0xe1a);
  }
  else {
    (**(code **)(lVar3 + 0x760))(program_id,iVar1,0x8a40,out_buffer_size);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"GetActiveUniformBlockiv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0xe1f);
    if (*out_buffer_size == 0) {
      this_02 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_02,"Unifom block size is 0",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                 ,0xe23);
    }
    else {
      std::operator<<(&local_328,"uniform_array");
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)&uniform_name_str,(string *)local_1b0);
      std::__cxx11::string::~string((string *)local_1b0);
      uniform_name = uniform_name_str._M_dataplus._M_p;
      (**(code **)(lVar3 + 0xb40))(program_id,1,&uniform_name,&index);
      dVar2 = (**(code **)(lVar3 + 0x800))();
      glu::checkError(dVar2,"GetUniformIndices",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                      ,0xe2e);
      if (index == 0xffffffff) {
        this_02 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_02,"Unifom is inactive",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                   ,0xe32);
      }
      else {
        std::vector<char,_std::allocator<char>_>::resize
                  (&extracted_uniform_name,uniform_name_str._M_string_length * 2);
        (**(code **)(lVar3 + 0x750))
                  (program_id,index,(int)uniform_name_str._M_string_length * 2,0,&size,&type,
                   extracted_uniform_name.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start);
        dVar2 = (**(code **)(lVar3 + 0x800))();
        glu::checkError(dVar2,"GetActiveUniform",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                        ,0xe3a);
        if ((size == local_38c) && (local_380->m_type == type)) {
          (**(code **)(lVar3 + 0x770))(program_id,1,&index,0x8a3b,&offset);
          dVar2 = (**(code **)(lVar3 + 0x800))();
          glu::checkError(dVar2,"GetActiveUniformsiv",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                          ,0xe48);
          if (offset == -1) {
            this_02 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (this_02,"Unifom has invalid offset",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                       ,0xe4c);
          }
          else {
            out_uniform_details->m_offset = offset;
            (**(code **)(lVar3 + 0x770))(program_id,1,&index,0x8a3d,&matrix_stride);
            dVar2 = (**(code **)(lVar3 + 0x800))();
            glu::checkError(dVar2,"GetActiveUniformsiv",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                            ,0xe53);
            if (matrix_stride == -1) {
              this_02 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (this_02,"Unifom has invalid matrix stride",(char *)0x0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                         ,0xe57);
            }
            else {
              out_uniform_details->m_matrix_stride = matrix_stride;
              (**(code **)(lVar3 + 0x770))(program_id,1,&index,0x8a3c,&array_stride);
              dVar2 = (**(code **)(lVar3 + 0x800))();
              glu::checkError(dVar2,"GetActiveUniformsiv",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                              ,0xe5e);
              if (matrix_stride != -1) {
                out_uniform_details->m_array_stride = array_stride;
                std::__cxx11::stringstream::~stringstream((stringstream *)&uniform_name_stream);
                std::__cxx11::string::~string((string *)&uniform_name_str);
                std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                          (&extracted_uniform_name.super__Vector_base<char,_std::allocator<char>_>);
                return;
              }
              this_02 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (this_02,"Unifom has invalid matrix stride",(char *)0x0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                         ,0xe62);
            }
          }
        }
        else {
          local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
          this_00 = (ostringstream *)(local_1b0 + 8);
          std::__cxx11::ostringstream::ostringstream(this_00);
          std::operator<<((ostream *)this_00,"Error. Invalid GetActiveUniform results.");
          std::operator<<((ostream *)this_00," Size: ");
          std::ostream::operator<<(this_00,size);
          std::operator<<((ostream *)this_00," expected: ");
          std::ostream::operator<<(this_00,local_38c);
          std::operator<<((ostream *)this_00,". Type: ");
          std::ostream::_M_insert<unsigned_long>((ulong)this_00);
          std::operator<<((ostream *)this_00," expected: ");
          this_01 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,&local_380->m_type);
          std::operator<<(&(this_01->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                          ". Name: ");
          std::operator<<(&(this_01->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                          extracted_uniform_name.super__Vector_base<char,_std::allocator<char>_>.
                          _M_impl.super__Vector_impl_data._M_start);
          tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(this_00);
          this_02 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this_02,"Invalid GetActiveUniform results",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                     ,0xe43);
        }
      }
    }
  }
  __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void GPUShaderFP64Test2::inspectProgram(glw::GLuint program_id, glw::GLint n_uniforms,
										const uniformTypeDetails& uniform_type, glw::GLint& out_buffer_size,
										uniformDetails& out_uniform_details, glw::GLuint uniform_block_index) const
{
	glw::GLint				 array_stride = 0;
	std::vector<glw::GLchar> extracted_uniform_name;
	const glw::Functions&	gl			   = m_context.getRenderContext().getFunctions();
	glw::GLuint				 index		   = 0;
	glw::GLint				 matrix_stride = 0;
	glw::GLint				 offset		   = 0;
	glw::GLsizei			 size		   = 0;
	glw::GLenum				 type		   = 0;
	const glw::GLchar*		 uniform_name  = 0;
	std::string				 uniform_name_str;
	std::stringstream		 uniform_name_stream;

	/* Get index of uniform block */
	uniform_block_index = gl.getUniformBlockIndex(program_id, m_uniform_block_name);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetUniformBlockIndex");

	if (GL_INVALID_INDEX == uniform_block_index)
	{
		TCU_FAIL("Unifom block is inactive");
	}

	/* Get size of uniform block */
	gl.getActiveUniformBlockiv(program_id, uniform_block_index, GL_UNIFORM_BLOCK_DATA_SIZE, &out_buffer_size);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetActiveUniformBlockiv");

	if (0 == out_buffer_size)
	{
		TCU_FAIL("Unifom block size is 0");
	}

	/* Prepare uniform name */
	uniform_name_stream << "uniform_array";

	uniform_name_str = uniform_name_stream.str();
	uniform_name	 = uniform_name_str.c_str();

	/* Get index of uniform */
	gl.getUniformIndices(program_id, 1 /* count */, &uniform_name, &index);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetUniformIndices");

	if (GL_INVALID_INDEX == index)
	{
		TCU_FAIL("Unifom is inactive");
	}

	/* Verify getActiveUniform results */
	extracted_uniform_name.resize(uniform_name_str.length() * 2);

	gl.getActiveUniform(program_id, index, (glw::GLsizei)(uniform_name_str.length() * 2) /* bufSize */, 0, &size, &type,
						&extracted_uniform_name[0]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetActiveUniform");

	if ((n_uniforms != size) || (uniform_type.m_type != type))
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Error. Invalid GetActiveUniform results."
											<< " Size: " << size << " expected: " << n_uniforms << ". Type: " << type
											<< " expected: " << uniform_type.m_type
											<< ". Name: " << &extracted_uniform_name[0] << tcu::TestLog::EndMessage;

		TCU_FAIL("Invalid GetActiveUniform results");
	}

	/* Get offset of uniform */
	gl.getActiveUniformsiv(program_id, 1 /* count */, &index, GL_UNIFORM_OFFSET, &offset);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetActiveUniformsiv");

	if (-1 == offset)
	{
		TCU_FAIL("Unifom has invalid offset");
	}

	out_uniform_details.m_offset = offset;

	/* Get matrix stride of uniform */
	gl.getActiveUniformsiv(program_id, 1 /* count */, &index, GL_UNIFORM_MATRIX_STRIDE, &matrix_stride);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetActiveUniformsiv");

	if (-1 == matrix_stride)
	{
		TCU_FAIL("Unifom has invalid matrix stride");
	}

	out_uniform_details.m_matrix_stride = matrix_stride;

	/* Get array stride of uniform */
	gl.getActiveUniformsiv(program_id, 1 /* count */, &index, GL_UNIFORM_ARRAY_STRIDE, &array_stride);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetActiveUniformsiv");

	if (-1 == matrix_stride)
	{
		TCU_FAIL("Unifom has invalid matrix stride");
	}

	out_uniform_details.m_array_stride = array_stride;
}